

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O3

void pybind11::detail::clear_instance(PyObject *self)

{
  ulong uVar1;
  pointer pptVar2;
  void *valueptr;
  long *plVar3;
  bool bVar4;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *pvVar5;
  internals *piVar6;
  _Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false> __it;
  undefined8 *puVar7;
  byte bVar8;
  pointer pptVar9;
  type_info *tinfo;
  long lVar10;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>_>
  pVar11;
  iterator __begin2;
  PyObject *self_00;
  value_and_holder local_58;
  void *local_38;
  
  pvVar5 = all_type_info(self->ob_type);
  pptVar9 = (pvVar5->
            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pptVar2 = (pvVar5->
            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pptVar9 == pptVar2) {
    tinfo = (type_info *)0x0;
  }
  else {
    tinfo = *pptVar9;
  }
  local_58.index = 0;
  local_58.vh = (void **)(self + 1);
  if ((self[3].ob_refcnt & 2) == 0) {
    local_58.vh = (void **)((PyObject *)local_58.vh)->ob_refcnt;
  }
  lVar10 = (long)pptVar2 - (long)pptVar9;
  self_00 = self;
  local_58.inst = (instance *)self;
  local_58.type = tinfo;
  if (lVar10 != 0) {
    do {
      valueptr = (void *)*(Py_ssize_t *)local_58.vh;
      if (valueptr != (void *)0x0) {
        if (((local_58.inst)->field_0x30 & 2) == 0) {
          bVar8 = *(byte *)((long)((local_58.inst)->field_1).simple_value_holder[1] + local_58.index
                           ) & 2;
        }
        else {
          bVar8 = (byte)(local_58.inst)->field_0x30 >> 3 & 1;
        }
        local_58.type = tinfo;
        if (bVar8 != 0) {
          local_38 = valueptr;
          piVar6 = get_internals();
          pVar11 = std::
                   _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                   ::equal_range(&(piVar6->registered_instances)._M_h,&local_38);
          for (__it._M_cur = (__node_type *)
                             pVar11.first.
                             super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                             ._M_cur;
              __it._M_cur !=
              (__node_type *)
              pVar11.second.
              super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
              ._M_cur; __it._M_cur = *__it._M_cur) {
            if (*(PyObject **)((long)__it._M_cur + 0x10) == self) {
              std::
              _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
              ::erase(&(piVar6->registered_instances)._M_h,(const_iterator)__it._M_cur);
              bVar4 = true;
              goto LAB_00113b63;
            }
          }
          bVar4 = false;
LAB_00113b63:
          if ((tinfo->field_0x90 & 2) == 0) {
            traverse_offset_bases(valueptr,tinfo,(instance *)self,deregister_instance_impl);
          }
          if (!bVar4) {
            pybind11_fail("pybind11_object_dealloc(): Tried to deallocate unregistered instance!");
          }
        }
        if ((self[3].ob_refcnt & 1) == 0) {
          if (((local_58.inst)->field_0x30 & 2) == 0) {
            bVar8 = *(byte *)((long)((local_58.inst)->field_1).simple_value_holder[1] +
                             local_58.index);
          }
          else {
            bVar8 = (byte)(local_58.inst)->field_0x30 >> 2;
          }
          if ((bVar8 & 1) == 0) goto LAB_00113bbd;
        }
        (*(local_58.type)->dealloc)(&local_58);
      }
LAB_00113bbd:
      if ((self_00[3].ob_refcnt & 2) == 0) {
        pptVar9 = (pvVar5->
                  super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_58.vh = (PyTypeObject **)((long)local_58.vh + 8) +
                      pptVar9[local_58.index]->holder_size_in_ptrs;
      }
      else {
        pptVar9 = (pvVar5->
                  super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      }
      uVar1 = local_58.index + 1;
      if (uVar1 < (ulong)((long)(pvVar5->
                                super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pptVar9 >> 3)) {
        tinfo = pptVar9[local_58.index + 1];
      }
      else {
        tinfo = (type_info *)0x0;
      }
      local_58.index = uVar1;
      local_58.type = tinfo;
    } while (uVar1 != lVar10 >> 3);
  }
  instance::deallocate_layout((instance *)self);
  if (self[2].ob_type != (PyTypeObject *)0x0) {
    PyObject_ClearWeakRefs(self);
  }
  puVar7 = (undefined8 *)_PyObject_GetDictPtr(self);
  if ((puVar7 != (undefined8 *)0x0) && (plVar3 = (long *)*puVar7, plVar3 != (long *)0x0)) {
    *puVar7 = 0;
    *plVar3 = *plVar3 + -1;
    if (*plVar3 == 0) {
      _Py_Dealloc();
    }
  }
  if ((self[3].ob_refcnt & 0x10) != 0) {
    clear_patients(self_00);
  }
  return;
}

Assistant:

inline void clear_instance(PyObject *self) {
    auto instance = reinterpret_cast<detail::instance *>(self);

    // Deallocate any values/holders, if present:
    for (auto &v_h : values_and_holders(instance)) {
        if (v_h) {

            // We have to deregister before we call dealloc because, for virtual MI types, we still
            // need to be able to get the parent pointers.
            if (v_h.instance_registered() && !deregister_instance(instance, v_h.value_ptr(), v_h.type))
                pybind11_fail("pybind11_object_dealloc(): Tried to deallocate unregistered instance!");

            if (instance->owned || v_h.holder_constructed())
                v_h.type->dealloc(v_h);
        }
    }
    // Deallocate the value/holder layout internals:
    instance->deallocate_layout();

    if (instance->weakrefs)
        PyObject_ClearWeakRefs(self);

    PyObject **dict_ptr = _PyObject_GetDictPtr(self);
    if (dict_ptr)
        Py_CLEAR(*dict_ptr);

    if (instance->has_patients)
        clear_patients(self);
}